

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

float Scl_LibertyReadPinCap(Scl_Tree_t *p,Scl_Item_t *pPin,char *pName)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  Scl_Item_t *pSVar7;
  double dVar8;
  
  uVar1 = pPin->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if ((int)uVar1 < 0) {
      pSVar7 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar7 = p->pItems + uVar1;
    }
    if (pSVar7 != (Scl_Item_t *)0x0) {
      pcVar5 = p->pContents;
      do {
        iVar3 = (pSVar7->Key).Beg;
        iVar6 = (pSVar7->Key).End - iVar3;
        iVar3 = strncmp(pcVar5 + iVar3,pName,(long)iVar6);
        if ((iVar3 == 0) && (sVar4 = strlen(pName), iVar6 == (int)sVar4)) {
          pcVar5 = Scl_LibertyReadString(p,pSVar7->Head);
          dVar8 = atof(pcVar5);
          return (float)dVar8;
        }
        uVar1 = pSVar7->Next;
        if (iVar2 <= (int)uVar1) goto LAB_0045f579;
        if ((int)uVar1 < 0) {
          pSVar7 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar7 = p->pItems + uVar1;
        }
      } while (pSVar7 != (Scl_Item_t *)0x0);
    }
    return 0.0;
  }
LAB_0045f579:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

float Scl_LibertyReadPinCap( Scl_Tree_t * p, Scl_Item_t * pPin, char * pName )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pPin, pItem, pName )
        return atof(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}